

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool __thiscall CS248::Shader::setVectorParameter(Shader *this,string *paramName,Vector3D *value)

{
  GLint GVar1;
  
  GVar1 = (*__glewGetUniformLocation)((this->programId_).id,(paramName->_M_dataplus)._M_p);
  if (-1 < GVar1) {
    (*__glewUniform3f)(GVar1,(float)value->x,(float)value->y,(float)value->z);
  }
  return -1 < GVar1;
}

Assistant:

bool Shader::setVectorParameter(const std::string& paramName, const Vector3D& value) {

    bool success = true;
    int uniformLocation = glGetUniformLocation(programId_.id, paramName.c_str());

    if (uniformLocation >= 0)
        glUniform3f(uniformLocation, value.x, value.y, value.z);
    else 
        success = false;

    return success;
}